

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.h
# Opt level: O0

bool __thiscall
SigningProvider::GetPubKeyByXOnly(SigningProvider *this,XOnlyPubKey *pubkey,CPubKey *out)

{
  long lVar1;
  bool bVar2;
  reference pCVar3;
  XOnlyPubKey *in_RDX;
  long *in_RDI;
  long in_FS_OFFSET;
  CKeyID *id;
  vector<CKeyID,_std::allocator<CKeyID>_> *__range1;
  iterator __end1;
  iterator __begin1;
  __normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
  *in_stack_ffffffffffffff68;
  vector<CKeyID,_std::allocator<CKeyID>_> *in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  byte in_stack_ffffffffffffff7f;
  undefined4 local_5c;
  undefined1 local_31;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  XOnlyPubKey::GetKeyIDs(in_RDX);
  std::vector<CKeyID,_std::allocator<CKeyID>_>::begin(in_stack_ffffffffffffff70);
  std::vector<CKeyID,_std::allocator<CKeyID>_>::end(in_stack_ffffffffffffff70);
  do {
    bVar2 = __gnu_cxx::operator==<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
                      ((__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_> *
                       )CONCAT17(in_stack_ffffffffffffff7f,
                                 CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),
                       (__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_> *
                       )in_stack_ffffffffffffff70);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_5c = 2;
LAB_00f6a940:
      std::vector<CKeyID,_std::allocator<CKeyID>_>::~vector
                ((vector<CKeyID,_std::allocator<CKeyID>_> *)
                 CONCAT17(in_stack_ffffffffffffff7f,
                          CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
      if (local_5c != 1) {
        local_31 = 0;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (bool)(local_31 & 1);
      }
      __stack_chk_fail();
    }
    pCVar3 = __gnu_cxx::__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>::
             operator*(in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff7f = (**(code **)(*in_RDI + 0x20))(in_RDI,pCVar3,in_RDX);
    if ((in_stack_ffffffffffffff7f & 1) != 0) {
      local_31 = 1;
      local_5c = 1;
      goto LAB_00f6a940;
    }
    __gnu_cxx::__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>::
    operator++(in_stack_ffffffffffffff68);
  } while( true );
}

Assistant:

bool GetPubKeyByXOnly(const XOnlyPubKey& pubkey, CPubKey& out) const
    {
        for (const auto& id : pubkey.GetKeyIDs()) {
            if (GetPubKey(id, out)) return true;
        }
        return false;
    }